

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall
binlog::PrettyPrinter::printEvent
          (PrettyPrinter *this,ostream *ostr,Event *event,WriterProp *writerProp,
          ClockSync *clockSync)

{
  char c;
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  OstreamBuffer out;
  OstreamBuffer local_440;
  
  detail::OstreamBuffer::OstreamBuffer(&local_440,ostr);
  this->_clockSync = clockSync;
  uVar2 = (this->_eventFormat)._M_string_length;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      pcVar1 = (this->_eventFormat)._M_dataplus._M_p;
      c = pcVar1[uVar4];
      if ((c == '%') && (uVar3 = uVar4 + 1, uVar4 = uVar2, uVar3 != uVar2)) {
        printEventField(this,&local_440,pcVar1[uVar3],event,writerProp);
        uVar4 = uVar3;
      }
      else {
        detail::OstreamBuffer::put(&local_440,c);
      }
      uVar4 = uVar4 + 1;
      uVar2 = (this->_eventFormat)._M_string_length;
    } while (uVar4 < uVar2);
  }
  detail::OstreamBuffer::~OstreamBuffer(&local_440);
  return;
}

Assistant:

void PrettyPrinter::printEvent(
  std::ostream& ostr,
  const Event& event,
  const WriterProp& writerProp,
  const ClockSync& clockSync
)
{
  detail::OstreamBuffer out(ostr);
  _clockSync = &clockSync;

  for (std::size_t i = 0; i < _eventFormat.size(); ++i)
  {
    const char c = _eventFormat[i];
    if (c == '%' && ++i != _eventFormat.size())
    {
      const char spec = _eventFormat[i];
      printEventField(out, spec, event, writerProp);
    }
    else
    {
      out.put(c);
    }
  }
}